

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

bool woff2::TransformHmtxTable(Font *font)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  *this_00;
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Table *pTVar8;
  Table *pTVar9;
  Table *pTVar10;
  iterator *piVar11;
  mapped_type *pmVar12;
  long lVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  iterator iVar17;
  size_type __n;
  short *psVar18;
  uint glyph_index;
  ushort *puVar19;
  int16_t lsb;
  uint16_t advance_width;
  vector<unsigned_short,_std::allocator<unsigned_short>_> advance_widths;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  ushort local_106;
  uint local_104;
  unsigned_short local_fe;
  uint local_fc;
  short *local_f8;
  iterator iStack_f0;
  short *local_e8;
  short *local_d8;
  iterator iStack_d0;
  short *local_c8;
  ushort *local_b8;
  iterator iStack_b0;
  unsigned_short *local_a8;
  size_t local_98;
  uint local_8c;
  ulong local_88;
  uint8_t *local_80;
  uint8_t *local_78;
  Glyph local_70;
  
  pTVar8 = Font::FindTable(font,0x676c7966);
  pTVar9 = Font::FindTable(font,0x686d7478);
  pTVar10 = Font::FindTable(font,0x68686561);
  bVar5 = true;
  if (pTVar8 != (Table *)0x0 && pTVar9 != (Table *)0x0) {
    if (((pTVar10 == (Table *)0x0) || (pTVar10->length < 0x24)) ||
       (uVar1 = *(ushort *)(pTVar10->data + 0x22), uVar1 == 0)) {
      bVar5 = false;
    }
    else {
      uVar6 = NumGlyphs(font);
      local_a8 = (unsigned_short *)0x0;
      local_b8 = (ushort *)0x0;
      iStack_b0._M_current = (ushort *)0x0;
      local_c8 = (short *)0x0;
      local_d8 = (short *)0x0;
      iStack_d0._M_current = (short *)0x0;
      local_e8 = (short *)0x0;
      local_f8 = (short *)0x0;
      iStack_f0._M_current = (short *)0x0;
      uVar7 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      bVar14 = (byte)uVar1;
      if ((int)uVar6 < 1) {
        local_104 = (uint)CONCAT71((uint7)bVar14,1);
        uVar7 = (uint)((int)uVar7 < (int)uVar6);
      }
      else {
        local_80 = pTVar9->data;
        local_88 = (ulong)pTVar9->length;
        local_fc = (uint)CONCAT11(bVar14,(int)uVar7 < (int)uVar6);
        this_00 = &local_70.contours;
        local_104 = (uint)CONCAT71((uint7)bVar14,1);
        glyph_index = 0;
        uVar15 = 0;
        local_8c = uVar7;
        do {
          local_70.instructions_size = 0;
          local_70.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_70.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_70.contours.
          super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_70.composite_data_size = 0;
          bVar5 = GetGlyphData(font,glyph_index,&local_78,&local_98);
          if ((!bVar5) ||
             ((local_98 != 0 && (bVar5 = ReadGlyph(local_78,local_98,&local_70), !bVar5)))) {
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(this_00);
            bVar5 = false;
            goto LAB_0010a295;
          }
          local_fe = 0;
          local_106 = 0;
          uVar16 = uVar15 + 2;
          if (glyph_index < local_8c) {
            if (uVar16 <= local_88) {
              local_fe = *(ushort *)(local_80 + uVar15) << 8 | *(ushort *)(local_80 + uVar15) >> 8;
              uVar15 = uVar15 + 4;
              if (uVar15 <= local_88) {
                local_106 = *(ushort *)(local_80 + uVar16) << 8 |
                            *(ushort *)(local_80 + uVar16) >> 8;
                uVar7 = local_104 & 0xff;
                local_104 = 0;
                if (local_70.x_min == local_106) {
                  local_104 = uVar7;
                }
                if (local_98 == 0) {
                  local_104 = uVar7;
                }
                if (iStack_b0._M_current == local_a8) {
                  std::vector<unsigned_short,std::allocator<unsigned_short>>::
                  _M_realloc_insert<unsigned_short_const&>
                            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_b8,
                             iStack_b0,&local_fe);
                }
                else {
                  *iStack_b0._M_current = local_fe;
                  iStack_b0._M_current = iStack_b0._M_current + 1;
                }
                uVar16 = uVar15;
                if (iStack_d0._M_current != local_c8) {
                  *iStack_d0._M_current = local_106;
                  piVar11 = &iStack_d0;
                  iVar17._M_current = iStack_d0._M_current;
                  goto LAB_0010a100;
                }
                std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                          ((vector<short,std::allocator<short>> *)&local_d8,iStack_d0,
                           (short *)&local_106);
                goto LAB_0010a118;
              }
            }
LAB_0010a286:
            bVar5 = false;
LAB_0010a28d:
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(this_00);
            goto LAB_0010a295;
          }
          if (local_88 < uVar16) goto LAB_0010a286;
          local_106 = *(ushort *)(local_80 + uVar15) << 8 | *(ushort *)(local_80 + uVar15) >> 8;
          uVar7 = local_fc & 0xff;
          local_fc = 0;
          if (local_70.x_min == local_106) {
            local_fc = uVar7;
          }
          if (local_98 == 0) {
            local_fc = uVar7;
          }
          if (iStack_f0._M_current == local_e8) {
            std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                      ((vector<short,std::allocator<short>> *)&local_f8,iStack_f0,
                       (short *)&local_106);
          }
          else {
            *iStack_f0._M_current = local_106;
            piVar11 = &iStack_f0;
            iVar17._M_current = iStack_f0._M_current;
LAB_0010a100:
            piVar11->_M_current = iVar17._M_current + 1;
          }
LAB_0010a118:
          if (((local_104 & 1) == 0) && ((local_fc & 1) == 0)) {
            bVar5 = true;
            goto LAB_0010a28d;
          }
          std::
          vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ::~vector(this_00);
          glyph_index = glyph_index + 1;
          uVar15 = uVar16;
          uVar7 = local_fc;
        } while (uVar6 != glyph_index);
      }
      local_70.x_min = -0xb08;
      local_70.x_max = -0x1713;
      pmVar12 = std::
                map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                ::operator[](&font->tables,(key_type *)&local_70);
      bVar14 = (byte)local_104 & 1;
      lVar13 = 0;
      if ((local_104 & 1) == 0) {
        lVar13 = (long)iStack_d0._M_current - (long)local_d8;
      }
      __n = (long)iStack_b0._M_current + (lVar13 - (long)local_b8) + 1;
      if ((uVar7 & 1) == 0) {
        __n = (long)iStack_f0._M_current + (__n - (long)local_f8);
      }
      else {
        bVar14 = bVar14 | 2;
      }
      this = &pmVar12->buffer;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(this,__n);
      puVar2 = (pmVar12->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (pmVar12->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this,(size_type)(puVar2 + (1 - (long)puVar3)));
      iVar4._M_current = iStack_b0._M_current;
      puVar2[(long)(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start - (long)puVar3] = bVar14;
      for (puVar19 = local_b8; iVar17._M_current = iStack_d0._M_current, puVar19 != iVar4._M_current
          ; puVar19 = puVar19 + 1) {
        anon_unknown_2::WriteUShort(this,(uint)*puVar19);
      }
      psVar18 = local_d8;
      if ((local_104 & 1) == 0) {
        for (; psVar18 != iVar17._M_current; psVar18 = psVar18 + 1) {
          anon_unknown_2::WriteUShort(this,(int)*psVar18);
        }
      }
      iVar17._M_current = iStack_f0._M_current;
      psVar18 = local_f8;
      if ((uVar7 & 1) == 0) {
        for (; psVar18 != iVar17._M_current; psVar18 = psVar18 + 1) {
          anon_unknown_2::WriteUShort(this,(int)*psVar18);
        }
      }
      pmVar12->tag = 0xe8edf4f8;
      pmVar12->flag_byte = '@';
      puVar2 = (pmVar12->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pmVar12->length =
           *(int *)&(pmVar12->buffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (int)puVar2;
      pmVar12->data = puVar2;
      bVar5 = true;
LAB_0010a295:
      if (local_f8 != (short *)0x0) {
        operator_delete(local_f8);
      }
      if (local_d8 != (short *)0x0) {
        operator_delete(local_d8);
      }
      if (local_b8 != (ushort *)0x0) {
        operator_delete(local_b8);
      }
    }
  }
  return bVar5;
}

Assistant:

bool TransformHmtxTable(Font* font) {
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* hmtx_table = font->FindTable(kHmtxTableTag);
  const Font::Table* hhea_table = font->FindTable(kHheaTableTag);

  // If you don't have hmtx or a glyf not much is going to happen here
  if (hmtx_table == NULL || glyf_table == NULL) {
    return true;
  }

  // hmtx without hhea doesn't make sense
  if (hhea_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Skip 34 to reach 'hhea' numberOfHMetrics
  Buffer hhea_buf(hhea_table->data, hhea_table->length);
  uint16_t num_hmetrics;
  if (!hhea_buf.Skip(34) || !hhea_buf.ReadU16(&num_hmetrics)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Must have at least one hMetric
  if (num_hmetrics < 1) {
    return FONT_COMPRESSION_FAILURE();
  }

  int num_glyphs = NumGlyphs(*font);

  // Most fonts can be transformed; assume it's a go until proven otherwise
  std::vector<uint16_t> advance_widths;
  std::vector<int16_t> proportional_lsbs;
  std::vector<int16_t> monospace_lsbs;

  bool remove_proportional_lsb = true;
  bool remove_monospace_lsb = (num_glyphs - num_hmetrics) > 0;

  Buffer hmtx_buf(hmtx_table->data, hmtx_table->length);
  for (int i = 0; i < num_glyphs; i++) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }

    uint16_t advance_width = 0;
    int16_t lsb = 0;

    if (i < num_hmetrics) {
      // [0, num_hmetrics) are proportional hMetrics
      if (!hmtx_buf.ReadU16(&advance_width)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_proportional_lsb = false;
      }

      advance_widths.push_back(advance_width);
      proportional_lsbs.push_back(lsb);
    } else {
      // [num_hmetrics, num_glyphs) are monospace leftSideBearing's
      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }
      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_monospace_lsb = false;
      }
      monospace_lsbs.push_back(lsb);
    }

    // If we know we can't optimize, bail out completely
    if (!remove_proportional_lsb && !remove_monospace_lsb) {
      return true;
    }
  }

  Font::Table* transformed_hmtx = &font->tables[kHmtxTableTag ^ 0x80808080];

  uint8_t flags = 0;
  size_t transformed_size = 1 + 2 * advance_widths.size();
  if (remove_proportional_lsb) {
    flags |= 1;
  } else {
    transformed_size += 2 * proportional_lsbs.size();
  }
  if (remove_monospace_lsb) {
    flags |= 1 << 1;
  } else {
    transformed_size += 2 * monospace_lsbs.size();
  }

  transformed_hmtx->buffer.reserve(transformed_size);
  std::vector<uint8_t>* out = &transformed_hmtx->buffer;
  WriteBytes(out, &flags, 1);
  for (uint16_t advance_width : advance_widths) {
    WriteUShort(out, advance_width);
  }

  if (!remove_proportional_lsb) {
    for (int16_t lsb : proportional_lsbs) {
      WriteUShort(out, lsb);
    }
  }
  if (!remove_monospace_lsb) {
    for (int16_t lsb : monospace_lsbs) {
      WriteUShort(out, lsb);
    }
  }

  transformed_hmtx->tag = kHmtxTableTag ^ 0x80808080;
  transformed_hmtx->flag_byte = 1 << 6;
  transformed_hmtx->length = transformed_hmtx->buffer.size();
  transformed_hmtx->data = transformed_hmtx->buffer.data();


  return true;
}